

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O2

int main(void)

{
  _Alloc_hider source_begin;
  _Alloc_hider source_begin_00;
  bool bVar1;
  ostream *poVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  char *pcVar5;
  runtime_error *prVar6;
  basic_stackstring<wchar_t,_char,_3UL> *pbVar7;
  basic_stackstring<wchar_t,_char,_5UL> *pbVar8;
  basic_stackstring<char,_wchar_t,_5UL> *pbVar9;
  basic_stackstring<char,_wchar_t,_10UL> *pbVar10;
  basic_stackstring<wchar_t,_char,_5UL> sw_1;
  wchar_t buf [6];
  wstring whello;
  string hello;
  ostringstream ss;
  char buf_1 [3];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hello,anon_var_dwarf_3c8f,(allocator<char> *)&ss);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&whello,L"שלום",(allocator<wchar_t> *)&ss);
  poVar2 = std::operator<<((ostream *)&std::cout,"- nowide::widen");
  std::endl<char,std::char_traits<char>>(poVar2);
  source_begin_00 = hello._M_dataplus;
  pcVar5 = hello._M_dataplus._M_p + 8;
  buf[0] = L'\0';
  buf[1] = L'\0';
  buf[2] = L'\0';
  buf[3] = L'\0';
  buf[4] = L'\0';
  buf[5] = L'\x01';
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,hello._M_dataplus._M_p,pcVar5);
  if (pwVar3 != buf) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,5,b,e)==buf in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x18);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(buf,&whello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error buf == whello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x19);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (buf[5] != L'\x01') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error buf[5] == 1 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1a);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,4,source_begin_00._M_p,pcVar5);
  if (pwVar3 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,4,b,e)==0 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1b);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,source_begin_00._M_p,source_begin_00._M_p + 7);
  if (pwVar3 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,5,b,e-1)==0 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1c);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,source_begin_00._M_p,source_begin_00._M_p + 6);
  if (pwVar3 != buf) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,5,b,e-2)==buf in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1d);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,source_begin_00._M_p,source_begin_00._M_p);
  if ((pwVar3 != buf) || (buf[0] != L'\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,5,b,b)==buf && buf[0]==0 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1e);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,source_begin_00._M_p,source_begin_00._M_p + 2);
  if (((pwVar3 != buf) || (buf[1] != L'\0')) || (buf[0] != *whello._M_dataplus._M_p)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "Error nowide::widen(buf,5,b,b+2)==buf && buf[1]==0 && buf[0]==whello[0] in "
                            );
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,anon_var_dwarf_3dcd,anon_var_dwarf_3dcd + 2);
  if (pwVar3 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,5,b,e)==0 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,anon_var_dwarf_3ded,anon_var_dwarf_3ded + 3);
  if (pwVar3 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,5,b,e)==0 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x25);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::basic_convert<wchar_t,char>(buf,5,anon_var_dwarf_3ded,anon_var_dwarf_3ded + 1);
  if (pwVar3 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::widen(buf,5,b,b+1)==0 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x26);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"- nowide::narrow");
  std::endl<char,std::char_traits<char>>(poVar2);
  source_begin = whello._M_dataplus;
  pwVar3 = whello._M_dataplus._M_p + 4;
  buf[0] = L'\0';
  buf[1] = L'\0';
  buf[2]._0_2_ = 0x100;
  pwVar4 = (wchar_t *)
           nowide::basic_convert<char,wchar_t>((char *)buf,9,whello._M_dataplus._M_p,pwVar3);
  if (pwVar4 != buf) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::narrow(buf,9,b,e)==buf in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==((char *)buf,&hello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error buf == hello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2f);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (buf[2]._1_1_ != '\x01') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error buf[9] == 1 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x30);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = nowide::basic_convert<char,wchar_t>((char *)buf,8,source_begin._M_p,pwVar3);
  if (pcVar5 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::narrow(buf,8,b,e)==0 in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x31);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = (wchar_t *)
           nowide::basic_convert<char,wchar_t>
                     ((char *)buf,7,source_begin._M_p,source_begin._M_p + 3);
  if (pwVar3 != buf) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error nowide::narrow(buf,7,b,e-1)==buf in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)&ss,(ulong)&hello);
  bVar1 = std::operator==((char *)buf,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error buf==hello.substr(0,6) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = nowide::narrow(buf_1,3,L"xy");
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"xy",(allocator<char> *)&sw_1);
  bVar1 = std::operator==(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "Error nowide::narrow(buf,3,L\"xy\")==std::string(\"xy\") in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar3 = nowide::widen(buf,3,"xy");
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&ss,L"xy",(allocator<wchar_t> *)&sw_1);
  bVar1 = std::operator==(pwVar3,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                  *)&ss);
  std::__cxx11::wstring::~wstring((wstring *)&ss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "Error nowide::widen(wbuf,3,\"xy\")==std::wstring(L\"xy\") in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x39);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"- nowide::stackstring");
  std::endl<char,std::char_traits<char>>(poVar2);
  buf[4] = L'\0';
  buf[5] = L'\0';
  bVar1 = nowide::basic_stackstring<wchar_t,_char,_3UL>::convert
                    ((basic_stackstring<wchar_t,_char,_3UL> *)buf,hello._M_dataplus._M_p);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.convert(hello.c_str()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3f);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar7 = (basic_stackstring<wchar_t,_char,_3UL> *)buf;
  if (buf._16_8_ != 0) {
    pbVar7 = (basic_stackstring<wchar_t,_char,_3UL> *)buf._16_8_;
  }
  bVar1 = std::operator==(pbVar7->buffer_,&whello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == whello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x40);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = nowide::basic_stackstring<wchar_t,_char,_3UL>::convert
                    ((basic_stackstring<wchar_t,_char,_3UL> *)buf,hello._M_dataplus._M_p,
                     hello._M_dataplus._M_p + hello._M_string_length);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "Error sw.convert(hello.c_str(),hello.c_str()+hello.size()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x41);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar7 = (basic_stackstring<wchar_t,_char,_3UL> *)buf;
  if (buf._16_8_ != 0) {
    pbVar7 = (basic_stackstring<wchar_t,_char,_3UL> *)buf._16_8_;
  }
  bVar1 = std::operator==(pbVar7->buffer_,&whello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == whello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x42);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nowide::basic_stackstring<wchar_t,_char,_3UL>::clear((basic_stackstring<wchar_t,_char,_3UL> *)buf)
  ;
  sw_1.mem_buffer_ = (output_char *)0x0;
  bVar1 = nowide::basic_stackstring<wchar_t,_char,_5UL>::convert(&sw_1,hello._M_dataplus._M_p);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.convert(hello.c_str()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)buf);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar8 = &sw_1;
  if (sw_1.mem_buffer_ != (output_char *)0x0) {
    pbVar8 = (basic_stackstring<wchar_t,_char,_5UL> *)sw_1.mem_buffer_;
  }
  bVar1 = std::operator==(pbVar8->buffer_,&whello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == whello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x47);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)buf);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = nowide::basic_stackstring<wchar_t,_char,_5UL>::convert
                    (&sw_1,hello._M_dataplus._M_p,hello._M_dataplus._M_p + hello._M_string_length);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "Error sw.convert(hello.c_str(),hello.c_str()+hello.size()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x48);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)buf);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar8 = &sw_1;
  if (sw_1.mem_buffer_ != (output_char *)0x0) {
    pbVar8 = (basic_stackstring<wchar_t,_char,_5UL> *)sw_1.mem_buffer_;
  }
  bVar1 = std::operator==(pbVar8->buffer_,&whello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == whello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x49);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)buf);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nowide::basic_stackstring<wchar_t,_char,_5UL>::clear(&sw_1);
  buf[2] = L'\0';
  buf[3] = L'\0';
  bVar1 = nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
                    ((basic_stackstring<char,_wchar_t,_5UL> *)buf,whello._M_dataplus._M_p);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.convert(whello.c_str()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4d);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar9 = (basic_stackstring<char,_wchar_t,_5UL> *)buf;
  if (buf._8_8_ != 0) {
    pbVar9 = (basic_stackstring<char,_wchar_t,_5UL> *)buf._8_8_;
  }
  bVar1 = std::operator==(pbVar9->buffer_,&hello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == hello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4e);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
                    ((basic_stackstring<char,_wchar_t,_5UL> *)buf,whello._M_dataplus._M_p,
                     whello._M_dataplus._M_p + whello._M_string_length);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "Error sw.convert(whello.c_str(),whello.c_str()+whello.size()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4f);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar9 = (basic_stackstring<char,_wchar_t,_5UL> *)buf;
  if (buf._8_8_ != 0) {
    pbVar9 = (basic_stackstring<char,_wchar_t,_5UL> *)buf._8_8_;
  }
  bVar1 = std::operator==(pbVar9->buffer_,&hello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == hello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x50);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nowide::basic_stackstring<char,_wchar_t,_5UL>::clear((basic_stackstring<char,_wchar_t,_5UL> *)buf)
  ;
  buf[4] = L'\0';
  buf[5] = L'\0';
  bVar1 = nowide::basic_stackstring<char,_wchar_t,_10UL>::convert
                    ((basic_stackstring<char,_wchar_t,_10UL> *)buf,whello._M_dataplus._M_p);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.convert(whello.c_str()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x54);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar10 = (basic_stackstring<char,_wchar_t,_10UL> *)buf;
  if (buf._16_8_ != 0) {
    pbVar10 = (basic_stackstring<char,_wchar_t,_10UL> *)buf._16_8_;
  }
  bVar1 = std::operator==(pbVar10->buffer_,&hello);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == hello in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x55);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = nowide::basic_stackstring<char,_wchar_t,_10UL>::convert
                    ((basic_stackstring<char,_wchar_t,_10UL> *)buf,whello._M_dataplus._M_p,
                     whello._M_dataplus._M_p + whello._M_string_length);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,
                             "Error sw.convert(whello.c_str(),whello.c_str()+whello.size()) in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                            );
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x56);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar10 = (basic_stackstring<char,_wchar_t,_10UL> *)buf;
  if (buf._16_8_ != 0) {
    pbVar10 = (basic_stackstring<char,_wchar_t,_10UL> *)buf._16_8_;
  }
  bVar1 = std::operator==(pbVar10->buffer_,&hello);
  if (bVar1) {
    nowide::basic_stackstring<char,_wchar_t,_10UL>::clear
              ((basic_stackstring<char,_wchar_t,_10UL> *)buf);
    std::__cxx11::wstring::~wstring((wstring *)&whello);
    std::__cxx11::string::~string((string *)&hello);
    poVar2 = std::operator<<((ostream *)&std::cout,"Passed");
    std::endl<char,std::char_traits<char>>(poVar2);
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = std::operator<<((ostream *)&ss,"Error sw.c_str() == hello in ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                          );
  poVar2 = std::operator<<(poVar2,':');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x57);
  poVar2 = std::operator<<(poVar2," ");
  std::operator<<(poVar2,"main");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&sw_1);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string hello = "\xd7\xa9\xd7\x9c\xd7\x95\xd7\x9d";
        std::wstring whello = L"\u05e9\u05dc\u05d5\u05dd";
        std::cout << "- nowide::widen" << std::endl;
        {
            char const *b=hello.c_str();
            char const *e=b+8;
            wchar_t buf[6] = { 0,0,0,0,0,1 };
            TEST(nowide::widen(buf,5,b,e)==buf);
            TEST(buf == whello);
            TEST(buf[5] == 1);
            TEST(nowide::widen(buf,4,b,e)==0);
            TEST(nowide::widen(buf,5,b,e-1)==0);
            TEST(nowide::widen(buf,5,b,e-2)==buf);
            TEST(nowide::widen(buf,5,b,b)==buf && buf[0]==0);
            TEST(nowide::widen(buf,5,b,b+2)==buf && buf[1]==0 && buf[0]==whello[0]);
            b="\xFF\xFF";
            e=b+2;
            TEST(nowide::widen(buf,5,b,e)==0);
            b="\xd7\xa9\xFF";
            e=b+3;
            TEST(nowide::widen(buf,5,b,e)==0);
            TEST(nowide::widen(buf,5,b,b+1)==0);
        }
        std::cout << "- nowide::narrow" << std::endl;
        {
            wchar_t const *b=whello.c_str();
            wchar_t const *e=b+4;
            char buf[10] = {0};
            buf[9]=1;
            TEST(nowide::narrow(buf,9,b,e)==buf);
            TEST(buf == hello);
            TEST(buf[9] == 1);
            TEST(nowide::narrow(buf,8,b,e)==0);
            TEST(nowide::narrow(buf,7,b,e-1)==buf);
            TEST(buf==hello.substr(0,6));
        }
        {
            char buf[3];
            wchar_t wbuf[3];
            TEST(nowide::narrow(buf,3,L"xy")==std::string("xy"));
            TEST(nowide::widen(wbuf,3,"xy")==std::wstring(L"xy"));
        }
        std::cout << "- nowide::stackstring" << std::endl;
        {
            {
                nowide::basic_stackstring<wchar_t,char,3> sw;
                TEST(sw.convert(hello.c_str()));
                TEST(sw.c_str() == whello);
                TEST(sw.convert(hello.c_str(),hello.c_str()+hello.size()));
                TEST(sw.c_str() == whello);
            }
            {
                nowide::basic_stackstring<wchar_t,char,5> sw;
                TEST(sw.convert(hello.c_str()));
                TEST(sw.c_str() == whello);
                TEST(sw.convert(hello.c_str(),hello.c_str()+hello.size()));
                TEST(sw.c_str() == whello);
            }
            {
                nowide::basic_stackstring<char,wchar_t,5> sw;
                TEST(sw.convert(whello.c_str()));
                TEST(sw.c_str() == hello);
                TEST(sw.convert(whello.c_str(),whello.c_str()+whello.size()));
                TEST(sw.c_str() == hello);
            }
            {
                nowide::basic_stackstring<char,wchar_t,10> sw;
                TEST(sw.convert(whello.c_str()));
                TEST(sw.c_str() == hello);
                TEST(sw.convert(whello.c_str(),whello.c_str()+whello.size()));
                TEST(sw.c_str() == hello);
            }
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Failed :" << e.what() << std::endl;
        return 1;
    }
    std::cout << "Passed" << std::endl;
    return 0;
}